

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

ostream * perf::operator<<(ostream *o,suite *suite)

{
  bool bVar1;
  ostream *poVar2;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *in_RSI;
  ostream *in_RDI;
  duration *in_stack_00000078;
  perf_case c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *__range1;
  string time_str;
  string success_str;
  string name_str;
  string num_str;
  unsigned_long num;
  size_type max_name_length;
  string num_cases_str;
  size_type num_cases;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *in_stack_fffffffffffffdb8;
  perf_case *in_stack_fffffffffffffdc0;
  ostream *in_stack_fffffffffffffdd0;
  char __rhs;
  perf_case *in_stack_fffffffffffffdd8;
  perf_case *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffdf8;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [96];
  byte local_120;
  perf_case *local_110;
  __normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
  local_108;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *local_100;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  long local_78;
  perf_case *local_68;
  perf_case *local_50;
  __normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
  local_48;
  long local_40;
  string local_38 [32];
  size_type local_18;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::size(in_RSI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdf8);
  local_50 = (perf_case *)
             std::begin<std::vector<perf::perf_case,std::allocator<perf::perf_case>>>
                       (in_stack_fffffffffffffdb8);
  local_68 = (perf_case *)
             std::end<std::vector<perf::perf_case,std::allocator<perf::perf_case>>>
                       (in_stack_fffffffffffffdb8);
  local_48 = std::operator<<(local_50,local_68);
  __gnu_cxx::
  __normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
  ::operator->(&local_48);
  local_40 = std::__cxx11::string::size();
  local_78 = 0;
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8);
  local_100 = local_10;
  local_108._M_current =
       (perf_case *)
       std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::begin
                 (in_stack_fffffffffffffdb8);
  local_110 = (perf_case *)
              std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::end
                        (in_stack_fffffffffffffdb8);
  while( true ) {
    __rhs = (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
    ::operator*(&local_108);
    perf_case::perf_case(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_78 = local_78 + 1;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdf8);
    std::__cxx11::string::operator=(local_98,local_180);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::length();
    lengthen_string((string *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,'\0');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdd8,__rhs);
    std::__cxx11::string::operator=(local_b8,local_1a0);
    std::__cxx11::string::~string(local_1a0);
    if (local_40 + 1U < 0x1e) {
      lengthen_string((string *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,'\0');
    }
    else {
      lengthen_string((string *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,'\0');
    }
    if ((local_120 & 1) == 0) {
      std::__cxx11::string::operator=(local_d8,"  Failed  ");
    }
    else {
      std::__cxx11::string::operator=(local_d8,"  Passed  ");
    }
    format_duration_abi_cxx11_(in_stack_00000078);
    std::__cxx11::string::operator=(local_f8,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    poVar2 = std::operator<<(local_8,local_98);
    poVar2 = std::operator<<(poVar2,'/');
    in_stack_fffffffffffffdf8 = std::operator<<(poVar2,local_38);
    poVar2 = std::operator<<(in_stack_fffffffffffffdf8,' ');
    poVar2 = std::operator<<(poVar2,"Case #");
    in_stack_fffffffffffffde0 = (perf_case *)std::operator<<(poVar2,local_98);
    in_stack_fffffffffffffdd8 =
         (perf_case *)std::operator<<((ostream *)in_stack_fffffffffffffde0,": ");
    in_stack_fffffffffffffdd0 = std::operator<<((ostream *)in_stack_fffffffffffffdd8,local_b8);
    poVar2 = std::operator<<(in_stack_fffffffffffffdd0,local_d8);
    in_stack_fffffffffffffdc0 = (perf_case *)std::operator<<(poVar2,local_f8);
    std::operator<<((ostream *)in_stack_fffffffffffffdc0,'\n');
    perf_case::~perf_case(in_stack_fffffffffffffdc0);
    __gnu_cxx::
    __normal_iterator<const_perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
    ::operator++(&local_108);
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const suite &suite)
    {
        auto num_cases = suite.m_cases.size();
        auto num_cases_str = std::to_string(num_cases);

        auto max_name_length = std::max_element(std::begin(suite.m_cases), std::end(suite.m_cases), [](const perf_case &a, const perf_case &b)
                                                { return a.name.size() < b.name.size(); })
                                   ->name.size();

        auto num = 0ul;
        auto num_str = std::string(), name_str = std::string(), success_str = std::string(), time_str = std::string();
        for (auto c : suite.m_cases)
        {
            num++;
            num_str = std::to_string(num);
            lengthen_string(num_str, num_cases_str.length());
            name_str = c.name + ' ';
            if (30 > max_name_length + 1)
            {
                lengthen_string(name_str, 30, '.');
            }
            else
            {
                lengthen_string(name_str, max_name_length + 1, '.');
            }
            if (c.success)
                success_str = "  Passed  ";
            else
                success_str = "  Failed  ";
            time_str = format_duration(c.time);

            o << num_str << '/' << num_cases_str << ' ' << "Case #" << num_str << ": " << name_str << success_str << time_str << '\n';
        }

        return o;
    }